

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

nng_err http_add_header(nng_http *conn,char *key,char *val)

{
  int iVar1;
  nng_err nVar2;
  char *pcVar3;
  http_header *local_50;
  char *pcStack_40;
  int rv;
  char *news;
  http_header *h;
  nni_http_entity *data;
  char *val_local;
  char *key_local;
  nng_http *conn_local;
  
  if ((conn->client & 1U) == 0) {
    local_50 = (http_header *)&conn->res;
  }
  else {
    local_50 = (http_header *)&conn->req;
  }
  h = local_50;
  data = (nni_http_entity *)val;
  val_local = key;
  key_local = (char *)conn;
  news = (char *)nni_list_first((nni_list *)&local_50[6].value);
  while( true ) {
    if (news == (char *)0x0) {
      news = (char *)nni_zalloc(0x28);
      if (news == (char *)0x0) {
        conn_local._4_4_ = NNG_ENOMEM;
      }
      else {
        news[0x20] = news[0x20] & 0xfbU | 4;
        pcVar3 = nni_strdup(val_local);
        *(char **)news = pcVar3;
        if (pcVar3 == (char *)0x0) {
          nni_free(news,0x28);
          conn_local._4_4_ = NNG_ENOMEM;
        }
        else {
          pcVar3 = nni_strdup((char *)data);
          *(char **)(news + 8) = pcVar3;
          if (pcVar3 == (char *)0x0) {
            nni_strfree(*(char **)news);
            nni_free(news,0x28);
            conn_local._4_4_ = NNG_ENOMEM;
          }
          else {
            nni_list_append((nni_list *)&h[6].value,news);
            conn_local._4_4_ = NNG_OK;
          }
        }
      }
      return conn_local._4_4_;
    }
    iVar1 = nni_strcasecmp(val_local,*(char **)news);
    if (iVar1 == 0) break;
    news = (char *)nni_list_next((nni_list *)&h[6].value,news);
  }
  nVar2 = nni_asprintf(&stack0xffffffffffffffc0,"%s, %s",*(undefined8 *)(news + 8),data);
  if (nVar2 != NNG_OK) {
    return nVar2;
  }
  if (((byte)news[0x20] >> 1 & 1) == 0) {
    nni_strfree(*(char **)(news + 8));
  }
  *(char **)(news + 8) = pcStack_40;
  return NNG_OK;
}

Assistant:

static nng_err
http_add_header(nng_http *conn, const char *key, const char *val)
{
	nni_http_entity *data =
	    conn->client ? &conn->req.data : &conn->res.data;
	http_header *h;
	NNI_LIST_FOREACH (&data->hdrs, h) {
		if (nni_strcasecmp(key, h->name) == 0) {
			char *news;
			int   rv;
			rv = nni_asprintf(&news, "%s, %s", h->value, val);
			if (rv != NNG_OK) {
				return (rv);
			}
			if (!h->static_value) {
				nni_strfree(h->value);
			}
			h->value = news;
			return (NNG_OK);
		}
	}

	if ((h = NNI_ALLOC_STRUCT(h)) == NULL) {
		return (NNG_ENOMEM);
	}
	h->alloc_header = true;
	if ((h->name = nni_strdup(key)) == NULL) {
		NNI_FREE_STRUCT(h);
		return (NNG_ENOMEM);
	}
	if ((h->value = nni_strdup(val)) == NULL) {
		nni_strfree(h->name);
		NNI_FREE_STRUCT(h);
		return (NNG_ENOMEM);
	}
	nni_list_append(&data->hdrs, h);
	return (NNG_OK);
}